

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O0

void __thiscall cmDepends::SetIncludePathFromLanguage(cmDepends *this,string *lang)

{
  string_view arg;
  bool bVar1;
  cmMakefile *this_00;
  string *psVar2;
  cmAlphaNum local_148;
  cmAlphaNum local_118;
  string local_e8;
  string_view local_c8;
  cmValue local_b8;
  cmValue includePath;
  cmMakefile *mf;
  cmAlphaNum local_68;
  undefined1 local_38 [8];
  string includePathVar;
  string *lang_local;
  cmDepends *this_local;
  
  includePathVar.field_2._8_8_ = lang;
  cmAlphaNum::cmAlphaNum(&local_68,"CMAKE_");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&mf,(string *)includePathVar.field_2._8_8_);
  cmStrCat<char[21]>((string *)local_38,&local_68,(cmAlphaNum *)&mf,
                     (char (*) [21])"_TARGET_INCLUDE_PATH");
  this_00 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)this->LocalGenerator);
  local_b8 = cmMakefile::GetDefinition(this_00,(string *)local_38);
  bVar1 = cmValue::operator_cast_to_bool(&local_b8);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_b8);
    local_c8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
    cmExpandList(local_c8,&this->IncludePath,false);
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_118,"CMAKE_");
    cmAlphaNum::cmAlphaNum(&local_148,(string *)includePathVar.field_2._8_8_);
    cmStrCat<char[14]>(&local_e8,&local_118,&local_148,(char (*) [14])0xc45e16);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    local_b8 = cmMakefile::GetDefinition(this_00,(string *)local_38);
    bVar1 = cmValue::operator_cast_to_bool(&local_b8);
    if (bVar1) {
      psVar2 = cmValue::operator*[abi_cxx11_(&local_b8);
      arg = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
      cmExpandList(arg,&this->IncludePath,false);
    }
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmDepends::SetIncludePathFromLanguage(const std::string& lang)
{
  // Look for the new per "TARGET_" variant first:
  std::string includePathVar =
    cmStrCat("CMAKE_", lang, "_TARGET_INCLUDE_PATH");
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  cmValue includePath = mf->GetDefinition(includePathVar);
  if (includePath) {
    cmExpandList(*includePath, this->IncludePath);
  } else {
    // Fallback to the old directory level variable if no per-target var:
    includePathVar = cmStrCat("CMAKE_", lang, "_INCLUDE_PATH");
    includePath = mf->GetDefinition(includePathVar);
    if (includePath) {
      cmExpandList(*includePath, this->IncludePath);
    }
  }
}